

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdlib.cpp
# Opt level: O1

void ScanDirectory(TArray<FFileList,_FFileList> *list,char *dirpath)

{
  FFileList *pFVar1;
  uint uVar2;
  DIR *__dirp;
  dirent *pdVar3;
  FString *this;
  bool bVar4;
  FString newdir;
  stat fileStat;
  FString local_d0;
  char *local_c8;
  stat local_c0;
  
  local_c8 = dirpath;
  __dirp = opendir(dirpath);
  if (__dirp != (DIR *)0x0) {
    pdVar3 = readdir(__dirp);
    while (pdVar3 != (dirent *)0x0) {
      if (pdVar3->d_name[0] != '.') {
        uVar2 = TArray<FFileList,_FFileList>::Reserve(list,1);
        pFVar1 = list->Array;
        this = FString::operator+=(&pFVar1[uVar2].Filename,local_c8);
        FString::operator+=(this,pdVar3->d_name);
        stat(pFVar1[uVar2].Filename.Chars,&local_c0);
        bVar4 = (local_c0.st_mode & 0xf000) == 0x4000;
        pFVar1[uVar2].isDirectory = bVar4;
        if (bVar4) {
          FString::AttachToOther(&local_d0,&pFVar1[uVar2].Filename);
          FString::operator+=(&local_d0,"/");
          ScanDirectory(list,local_d0.Chars);
          FString::~FString(&local_d0);
        }
      }
      pdVar3 = readdir(__dirp);
    }
    closedir(__dirp);
  }
  return;
}

Assistant:

void ScanDirectory(TArray<FFileList> &list, const char *dirpath)
{
	DIR *directory = opendir(dirpath);
	if(directory == NULL)
		return;

	struct dirent *file;
	while((file = readdir(directory)) != NULL)
	{
		if(file->d_name[0] == '.') //File is hidden or ./.. directory so ignore it.
			continue;

		FFileList *fl = &list[list.Reserve(1)];
		fl->Filename << dirpath << file->d_name;

		struct stat fileStat;
		stat(fl->Filename, &fileStat);
		fl->isDirectory = S_ISDIR(fileStat.st_mode);

		if(fl->isDirectory)
		{
			FString newdir = fl->Filename;
			newdir += "/";
			ScanDirectory(list, newdir);
			continue;
		}
	}

	closedir(directory);
}